

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerSMC.cpp
# Opt level: O3

void __thiscall
chrono::ChContactContainerSMC::AddContact(ChContactContainerSMC *this,ChCollisionInfo *cinfo)

{
  ChContactable *pCVar1;
  ChContactable *pCVar2;
  ChMaterialCompositionStrategy *strategy;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  long *plVar3;
  int iVar4;
  ChMaterialCompositeSMC cmat;
  shared_ptr<chrono::ChMaterialSurfaceSMC> local_90;
  shared_ptr<chrono::ChMaterialSurfaceSMC> local_80;
  long *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  ChMaterialCompositeSMC local_60;
  
  pCVar1 = cinfo->modelA->mcontactable;
  if (pCVar1 == (ChContactable *)0x0) {
    __assert_fail("cinfo.modelA->GetContactable()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactContainerSMC.cpp"
                  ,0xe1,
                  "virtual void chrono::ChContactContainerSMC::AddContact(const collision::ChCollisionInfo &)"
                 );
  }
  pCVar2 = cinfo->modelB->mcontactable;
  if (pCVar2 == (ChContactable *)0x0) {
    __assert_fail("cinfo.modelB->GetContactable()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactContainerSMC.cpp"
                  ,0xe2,
                  "virtual void chrono::ChContactContainerSMC::AddContact(const collision::ChCollisionInfo &)"
                 );
  }
  if (0.0 <= cinfo->distance) {
    return;
  }
  iVar4 = (*pCVar1->_vptr_ChContactable[2])();
  if (((char)iVar4 == '\0') &&
     (iVar4 = (*pCVar2->_vptr_ChContactable[2])(pCVar2), (char)iVar4 == '\0')) {
    return;
  }
  iVar4 = (*((cinfo->shapeA->m_material).
             super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_ChMaterialSurface[3])();
  if (iVar4 != 1) {
    return;
  }
  iVar4 = (*((cinfo->shapeB->m_material).
             super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_ChMaterialSurface[3])();
  if (iVar4 != 1) {
    return;
  }
  strategy = (((this->super_ChContactContainer).super_ChPhysicsItem.system)->composition_strategy).
             _M_t.
             super___uniq_ptr_impl<chrono::ChMaterialCompositionStrategy,_std::default_delete<chrono::ChMaterialCompositionStrategy>_>
             ._M_t.
             super__Tuple_impl<0UL,_chrono::ChMaterialCompositionStrategy_*,_std::default_delete<chrono::ChMaterialCompositionStrategy>_>
             .super__Head_base<0UL,_chrono::ChMaterialCompositionStrategy_*,_false>._M_head_impl;
  local_80.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (cinfo->shapeA->m_material).
       super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (cinfo->shapeA->m_material).
            super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_80.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_80.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this_00;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
        goto LAB_00565564;
      }
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
LAB_00565564:
  local_90.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (cinfo->shapeB->m_material).
       super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (cinfo->shapeB->m_material).
            super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_90.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_90.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this_01;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
        goto LAB_005655c0;
      }
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
    this_01->_M_use_count = this_01->_M_use_count + 1;
  }
LAB_005655c0:
  ChMaterialCompositeSMC::ChMaterialCompositeSMC(&local_60,strategy,&local_80,&local_90);
  if (local_90.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (local_80.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (*(this->super_ChContactContainer).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x43])
            (&local_70,this);
  plVar3 = local_70;
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (plVar3 != (long *)0x0) {
    (*(this->super_ChContactContainer).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x43])
              (&local_70,this);
    (**(code **)(*local_70 + 0x10))(local_70,cinfo,&local_60);
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    }
  }
  InsertContact(this,cinfo,&local_60);
  return;
}

Assistant:

void ChContactContainerSMC::AddContact(const collision::ChCollisionInfo& cinfo) {
    assert(cinfo.modelA->GetContactable());
    assert(cinfo.modelB->GetContactable());

    // Do nothing if the shapes are separated
    if (cinfo.distance >= 0)
        return;

    auto contactableA = cinfo.modelA->GetContactable();
    auto contactableB = cinfo.modelB->GetContactable();

    // Do nothing if any of the contactables is not contact-active
    if (!contactableA->IsContactActive() && !contactableB->IsContactActive())
        return;

    // Check that the two collision models are compatible with penalty contact.
    if (cinfo.shapeA->GetContactMethod() != ChContactMethod::SMC ||
        cinfo.shapeB->GetContactMethod() != ChContactMethod::SMC) {
        return;
    }

    // Create the composite material
    ChMaterialCompositeSMC cmat(GetSystem()->composition_strategy.get(),
                                std::static_pointer_cast<ChMaterialSurfaceSMC>(cinfo.shapeA->GetMaterial()),
                                std::static_pointer_cast<ChMaterialSurfaceSMC>(cinfo.shapeB->GetMaterial()));

    // Check for a user-provided callback to modify the material
    if (GetAddContactCallback()) {
        GetAddContactCallback()->OnAddContact(cinfo, &cmat);
    }

    InsertContact(cinfo, cmat);
}